

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# containers.h
# Opt level: O2

void container_add_offset
               (container_t *c,uint8_t type,container_t **lo,container_t **hi,uint16_t offset)

{
  int iVar1;
  undefined7 in_register_00000031;
  
  iVar1 = (int)CONCAT71(in_register_00000031,type);
  if (iVar1 == 3) {
    run_container_offset((run_container_t *)c,lo,hi,offset);
    return;
  }
  if (iVar1 == 2) {
    array_container_offset((array_container_t *)c,lo,hi,offset);
    return;
  }
  bitset_container_offset((bitset_container_t *)c,lo,hi,offset);
  return;
}

Assistant:

static inline void container_add_offset(const container_t *c, uint8_t type,
                                        container_t **lo, container_t **hi,
                                        uint16_t offset) {
    assert(offset != 0);
    assert(container_nonzero_cardinality(c, type));
    assert(lo != NULL || hi != NULL);
    assert(lo == NULL || *lo == NULL);
    assert(hi == NULL || *hi == NULL);

    switch (type) {
        case BITSET_CONTAINER_TYPE:
            bitset_container_offset(const_CAST_bitset(c), lo, hi, offset);
            break;
        case ARRAY_CONTAINER_TYPE:
            array_container_offset(const_CAST_array(c), lo, hi, offset);
            break;
        case RUN_CONTAINER_TYPE:
            run_container_offset(const_CAST_run(c), lo, hi, offset);
            break;
        default:
            assert(false);
            roaring_unreachable;
            break;
    }
}